

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

void __thiscall
webfront::log::debug<unsigned_long>::debug
          (debug<unsigned_long> *this,string_view fmt,unsigned_long *ts,srcLoc *l)

{
  double __x;
  string local_30;
  
  if (logTypeEnabled._4_1_ == '\x01') {
    http::std::format<unsigned_long>(&local_30,fmt,ts);
    anon_unknown_4::log(__x);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

debug(string_view fmt, Ts&&... ts, const srcLoc& l = srcLoc::current()) {
    if (is(Debug)) log(Debug, fmt, l, std::forward<Ts>(ts)...);
    }